

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O2

Value * __thiscall
soul::Value::cloneWithEquivalentType(Value *__return_storage_ptr__,Value *this,Type *newType)

{
  undefined4 uVar1;
  Type *pTVar2;
  bool bVar3;
  uint8_t *sourceData;
  Type local_50;
  Type local_38;
  
  bVar3 = Type::hasIdenticalLayout(newType,&this->type);
  if (bVar3) {
    bVar3 = isZero(this);
    uVar1._0_1_ = newType->category;
    uVar1._1_1_ = newType->arrayElementCategory;
    uVar1._2_1_ = newType->isRef;
    uVar1._3_1_ = newType->isConstant;
    if (bVar3) {
      pTVar2 = &local_38;
      local_38.primitiveType.type = (newType->primitiveType).type;
      local_38.boundingSize = newType->boundingSize;
      local_38.arrayElementBoundingSize = newType->arrayElementBoundingSize;
      local_38.structure.object = (newType->structure).object;
      (newType->structure).object = (Structure *)0x0;
      local_38._0_4_ = uVar1;
      Value(__return_storage_ptr__,&local_38);
    }
    else {
      pTVar2 = &local_50;
      local_50.primitiveType.type = (newType->primitiveType).type;
      local_50.boundingSize = newType->boundingSize;
      local_50.arrayElementBoundingSize = newType->arrayElementBoundingSize;
      local_50.structure.object = (newType->structure).object;
      (newType->structure).object = (Structure *)0x0;
      local_50._0_4_ = uVar1;
      sourceData = LazyAllocatedData::data(&this->allocatedData);
      Value(__return_storage_ptr__,&local_50,sourceData);
    }
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&pTVar2->structure);
    return __return_storage_ptr__;
  }
  throwInternalCompilerError("newType.hasIdenticalLayout (type)","cloneWithEquivalentType",0x296);
}

Assistant:

Value Value::cloneWithEquivalentType (Type newType) const
{
    SOUL_ASSERT (newType.hasIdenticalLayout (type));

    if (isZero())
        return Value (std::move (newType));

    return Value (std::move (newType), getPackedData());
}